

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RoboSimian::SetVisualizationTypeLimbs(RoboSimian *this,VisualizationType vis)

{
  bool bVar1;
  reference psVar2;
  element_type *this_00;
  undefined1 local_40 [8];
  shared_ptr<chrono::robosimian::RS_Limb> limb;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  *__range2;
  VisualizationType vis_local;
  RoboSimian *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
           ::begin(&this->m_limbs);
  limb.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
         ::end(&this->m_limbs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<chrono::robosimian::RS_Limb>_*,_std::vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>_>
                                *)&limb.
                                   super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<chrono::robosimian::RS_Limb>_*,_std::vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>_>
             ::operator*(&__end2);
    std::shared_ptr<chrono::robosimian::RS_Limb>::shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Limb> *)local_40,psVar2);
    this_00 = std::
              __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
    RS_Limb::SetVisualizationType(this_00,vis);
    std::shared_ptr<chrono::robosimian::RS_Limb>::~shared_ptr
              ((shared_ptr<chrono::robosimian::RS_Limb> *)local_40);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chrono::robosimian::RS_Limb>_*,_std::vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void RoboSimian::SetVisualizationTypeLimbs(VisualizationType vis) {
    for (auto limb : m_limbs)
        limb->SetVisualizationType(vis);
}